

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O1

void __thiscall cppnet::Dispatcher::~Dispatcher(Dispatcher *this)

{
  ~Dispatcher(this);
  operator_delete(this);
  return;
}

Assistant:

Dispatcher::~Dispatcher() {
    if (std::this_thread::get_id() != _local_thread_id) {
        Stop();
        Join();
    }
}